

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O3

void NES_APU_np_Reset(void *chip)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  NES_APU *apu;
  ulong uVar4;
  int iVar5;
  
  *(undefined4 *)((long)chip + 0x30) = 0;
  *(undefined8 *)((long)chip + 0x120) = 0;
  *(undefined8 *)((long)chip + 0xe8) = 0;
  *(undefined8 *)((long)chip + 0xf0) = 0;
  *(undefined8 *)((long)chip + 0xf8) = 0;
  *(undefined8 *)((long)chip + 0x100) = 0;
  *(undefined8 *)((long)chip + 0x108) = 0;
  *(undefined8 *)((long)chip + 0x110) = 0;
  *(undefined8 *)((long)chip + 0x116) = 0;
  lVar3 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    *(undefined4 *)((long)chip + lVar3 * 4 + 0x128) = 1;
    *(undefined4 *)((long)chip + lVar3 * 4 + 0x130) = 0;
    *(undefined1 *)((long)chip + lVar3 + 0x138) = 0;
    *(undefined1 *)((long)chip + lVar3 + 0x13a) = 0;
    *(undefined1 *)((long)chip + lVar3 + 0x13c) = 0;
    *(undefined4 *)((long)chip + lVar3 * 4 + 0x140) = 0;
    *(undefined4 *)((long)chip + lVar3 * 4 + 0x148) = 0;
    *(undefined4 *)((long)chip + lVar3 * 4 + 0x150) = 0;
    *(undefined4 *)((long)chip + lVar3 * 4 + 0x158) = 0;
    *(undefined1 *)((long)chip + lVar3 + 0x160) = 0;
    lVar3 = 1;
    bVar1 = false;
  } while (bVar2);
  iVar5 = -8;
  do {
    NES_APU_np_Write(chip,(short)iVar5 + 0x4008,'\0');
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0);
  *(undefined1 *)((long)chip + 0x49) = 0;
  *(undefined2 *)((long)chip + 0x160) = 0;
  *(undefined8 *)((long)chip + 0x158) = 0;
  if (*(int *)((long)chip + 8) != 0) {
    *(undefined2 *)((long)chip + 0x160) = 0x101;
    *(undefined1 *)((long)chip + 0x49) = 0xf;
  }
  if (*(int *)((long)chip + 0x18) != 0) {
    *(undefined2 *)((long)chip + 0x118) = 0;
    *(undefined8 *)((long)chip + 0x120) = 0;
    *(undefined1 *)((long)chip + 0x11a) = 1;
    *(undefined8 *)((long)chip + 0x130) = 0;
    *(undefined8 *)((long)chip + 0x110) = 0xffffffff;
    *(undefined1 *)((long)chip + 0x35) = 8;
    *(undefined2 *)((long)chip + 0x11b) = 0x101;
    *(undefined1 *)((long)chip + 0x11d) = 1;
    *(undefined1 *)((long)chip + 0x39) = 8;
  }
  *(undefined8 *)((long)chip + 0x54) = 0;
  uVar4 = 0xac44;
  if (*(uint *)((long)chip + 0x5c) != 0) {
    uVar4 = (ulong)*(uint *)((long)chip + 0x5c);
  }
  *(int *)((long)chip + 0x5c) = (int)uVar4;
  *(ulong *)((long)chip + 0x168) =
       (uVar4 >> 1 | (ulong)*(uint *)((long)chip + 0x60) << 0x20) / uVar4;
  *(undefined8 *)((long)chip + 0x170) = 0;
  return;
}

Assistant:

void NES_APU_np_Reset(void* chip)
{
	NES_APU* apu = (NES_APU*)chip;
	int i;
	apu->gclock = 0;
	//apu->mask = 0;

	for (i=0; i<2; ++i)
	{
		apu->scounter[i] = 0;
		apu->sphase[i] = 0;
		apu->duty[i] = 0;
		apu->volume[i] = 0;
		apu->freq[i] = 0;
		apu->sfreq[i] = 0;
		apu->sweep_enable[i] = 0;
		apu->sweep_mode[i] = 0;
		apu->sweep_write[i] = 0;
		apu->sweep_div_period[i] = 0;
		apu->sweep_div[i] = 1;
		apu->sweep_amount[i] = 0;
		apu->envelope_disable[i] = 0;
		apu->envelope_loop[i] = 0;
		apu->envelope_write[i] = 0;
		apu->envelope_div_period[i] = 0;
		apu->envelope_div[i] = 0;
		apu->envelope_counter[i] = 0;
		apu->length_counter[i] = 0;
		apu->enable[i] = 0;
	}

	for (i = 0x4000; i < 0x4008; i++)
		NES_APU_np_Write(apu, i, 0);

	NES_APU_np_Write(apu, 0x4015, 0);
	if (apu->option[OPT_UNMUTE_ON_RESET])
		NES_APU_np_Write(apu, 0x4015, 0x0f);
	if (apu->option[OPT_NEGATE_SWEEP_INIT])
	{
		NES_APU_np_Write(apu, 0x4001, 0x08);
		NES_APU_np_Write(apu, 0x4005, 0x08);
	}

	for (i = 0; i < 2; i++)
		apu->out[i] = 0;

	NES_APU_np_SetRate(apu, apu->rate);
	RC_RESET(&apu->tick_count);
}